

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysutil.c
# Opt level: O3

char * get_stat_databuf(stat *sbuf)

{
  long lVar1;
  tm *__tp;
  char *__format;
  time_t local_time;
  timeval tv;
  long local_28;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  local_28 = local_20.tv_sec;
  lVar1 = (sbuf->st_mtim).tv_sec;
  __format = "%b %e %H:%M";
  if (0xeff100 < local_20.tv_sec - lVar1) {
    __format = "%b %e    %Y";
  }
  if (local_20.tv_sec < lVar1) {
    __format = "%b %e    %Y";
  }
  __tp = localtime(&local_28);
  strftime(get_stat_databuf::databuf,0x40,__format,__tp);
  return get_stat_databuf::databuf;
}

Assistant:

const char *get_stat_databuf(struct stat *sbuf) {
  static char databuf[64] = {0};
  const char *p_data_format = "%b %e %H:%M";
  struct timeval tv;
  gettimeofday(&tv, NULL);
  time_t local_time = tv.tv_sec;
  if (sbuf->st_mtime > local_time || (local_time - sbuf->st_mtime) > HALF_YEAR_SEC) {
    p_data_format = "%b %e    %Y";
  }

  struct tm *p_tm = localtime(&local_time);
  strftime(databuf, sizeof(databuf), p_data_format, p_tm);

  return databuf;
}